

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_fun.c
# Opt level: O3

void ex_cosh(t_expr *e,long argc,ex_ex *argv,ex_ex *optr)

{
  int iVar1;
  t_float *ptVar2;
  t_float *ptVar3;
  long lVar4;
  double dVar5;
  
  lVar4 = argv->ex_type;
  if (lVar4 - 0xeU < 2) {
    if (optr->ex_type == 0xf) {
      ptVar3 = (optr->ex_cont).v_vec;
    }
    else {
      optr->ex_type = 0xf;
      ptVar3 = (t_float *)malloc((long)e->exp_vsize << 2);
      (optr->ex_cont).v_vec = ptVar3;
    }
    iVar1 = e->exp_vsize;
    if (iVar1 != 0) {
      ptVar2 = (argv->ex_cont).v_vec;
      lVar4 = 0;
      do {
        dVar5 = cosh((double)ptVar2[lVar4]);
        ptVar3[lVar4] = (float)dVar5;
        lVar4 = lVar4 + 1;
      } while (iVar1 != (int)lVar4);
    }
  }
  else {
    if (lVar4 == 2) {
      if (optr->ex_type == 0xf) {
        ptVar3 = (optr->ex_cont).v_vec;
        dVar5 = (double)(argv->ex_cont).v_flt;
        goto LAB_001a00a0;
      }
      optr->ex_type = 2;
      dVar5 = (double)(argv->ex_cont).v_flt;
    }
    else {
      if (lVar4 != 1) {
        pd_error(e,"expr: FUNV_EVAL_UNARY(%d): bad left type %ld\n",0x364);
        return;
      }
      if (optr->ex_type == 0xf) {
        ptVar3 = (optr->ex_cont).v_vec;
        dVar5 = (double)(argv->ex_cont).v_int;
LAB_001a00a0:
        dVar5 = cosh(dVar5);
        ex_mkvector(ptVar3,(float)dVar5,e->exp_vsize);
        return;
      }
      optr->ex_type = 2;
      dVar5 = (double)(argv->ex_cont).v_int;
    }
    dVar5 = cosh(dVar5);
    (optr->ex_cont).v_flt = (float)dVar5;
  }
  return;
}

Assistant:

static void
ex_cosh(t_expr *e, long int argc, struct ex_ex *argv, struct ex_ex *optr)
{
        struct ex_ex *left;
        t_float *op; /* output pointer */
        t_float *lp, *rp;         /* left and right vector pointers */
        t_float scalar;
        int j;

        left = argv++;

        FUNC_EVAL_UNARY(left, cosh, (double), optr, 1);
}